

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

bool __thiscall
MemoryLeakDetector::validMemoryCorruptionInformation(MemoryLeakDetector *this,char *memory)

{
  ulong uVar1;
  ulong uVar2;
  
  if (*memory != 'B') {
    return false;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 2) break;
    uVar1 = uVar2 + 1;
  } while (memory[uVar2 + 1] == "BAS"[uVar2 + 1]);
  return 1 < uVar2;
}

Assistant:

bool MemoryLeakDetector::validMemoryCorruptionInformation(char* memory)
{
   for (size_t i=0; i<memory_corruption_buffer_size; i++)
      if (memory[i] != GuardBytes[i % sizeof(GuardBytes)])
          return false;
   return true;
}